

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macho.cc
# Opt level: O0

void bloaty::macho::MaybeAddOverhead(RangeSink *sink,char *label,string_view data)

{
  char *in_RCX;
  long in_RDI;
  RangeSink *unaff_retaddr;
  undefined1 in_stack_00000008 [16];
  string_view in_stack_00000018;
  char *in_stack_ffffffffffffffc8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffd0;
  
  if (in_RDI != 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    RangeSink::AddFileRange(unaff_retaddr,in_RCX,in_stack_00000018,(string_view)in_stack_00000008);
  }
  return;
}

Assistant:

void MaybeAddOverhead(RangeSink* sink, const char* label, string_view data) {
  if (sink) {
    sink->AddFileRange("macho_overhead", label, data);
  }
}